

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

void tcp_listener_cb(void *arg,uint events)

{
  tcp_listener *l;
  uint events_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
  if ((events & 0x20) == 0) {
    tcp_listener_doaccept((tcp_listener *)arg);
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
  }
  else {
    tcp_listener_doclose((tcp_listener *)arg);
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
  }
  return;
}

Assistant:

static void
tcp_listener_cb(void *arg, unsigned events)
{
	tcp_listener *l = arg;

	nni_mtx_lock(&l->mtx);
	if ((events & NNI_POLL_INVAL) != 0) {
		tcp_listener_doclose(l);
		nni_mtx_unlock(&l->mtx);
		return;
	}

	// Anything else will turn up in accept.
	tcp_listener_doaccept(l);
	nni_mtx_unlock(&l->mtx);
}